

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tags.hpp
# Opt level: O2

IfTag * __thiscall Qentem::Tags::TagBit::MakeIfTag(TagBit *this)

{
  IfTag *pointer;
  
  pointer = (IfTag *)operator_new(0x18);
  MemoryRecord::AddAllocation(pointer);
  pointer->Offset = 0;
  pointer->EndOffset = 0;
  (pointer->Cases).storage_ = (IfTagCase *)0x0;
  (pointer->Cases).index_ = 0;
  (pointer->Cases).capacity_ = 0;
  this->type_ = If;
  this->storage_ = pointer;
  return pointer;
}

Assistant:

IfTag *MakeIfTag() {
        IfTag *tag = Memory::AllocateInit<IfTag>();

        type_    = TagType::If;
        storage_ = tag;

        return tag;
    }